

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_internal.h
# Opt level: O3

bool __thiscall
bssl::Vector<NotDefaultConstructible>::Push
          (Vector<NotDefaultConstructible> *this,NotDefaultConstructible *elem)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  ulong uVar3;
  NotDefaultConstructible *pNVar4;
  NotDefaultConstructible *pNVar5;
  long lVar6;
  int line;
  ulong uVar7;
  size_t sVar8;
  
  uVar7 = this->size_;
  uVar3 = this->capacity_;
  if (uVar7 < uVar3) {
    pNVar5 = this->data_;
  }
  else {
    if (uVar3 == 0) {
      sVar8 = 0x10;
    }
    else {
      if ((long)uVar3 < 0) {
        line = 0x14d;
LAB_003170b1:
        ERR_put_error(0xe,0,0x45,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_internal.h"
                      ,line);
        return false;
      }
      if (uVar3 >> 0x3b != 0) {
        line = 0x153;
        goto LAB_003170b1;
      }
      sVar8 = uVar3 * 2;
    }
    pNVar5 = (NotDefaultConstructible *)OPENSSL_malloc(sVar8 << 4);
    if (pNVar5 == (NotDefaultConstructible *)0x0) {
      return false;
    }
    uVar7 = this->size_;
    if (uVar7 != 0) {
      pNVar4 = this->data_;
      lVar6 = 0;
      do {
        puVar1 = (undefined8 *)((long)&(pNVar5->array).data_ + lVar6);
        *puVar1 = 0;
        puVar1[1] = 0;
        OPENSSL_free((void *)0x0);
        puVar1 = (undefined8 *)((long)&(pNVar5->array).data_ + lVar6);
        puVar2 = (undefined8 *)((long)&(pNVar4->array).data_ + lVar6);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined8 *)((long)&(pNVar5->array).data_ + lVar6) = *puVar2;
        *(undefined8 *)((long)&(pNVar5->array).size_ + lVar6) = puVar2[1];
        *puVar2 = 0;
        puVar2[1] = 0;
        lVar6 = lVar6 + 0x10;
      } while ((NotDefaultConstructible *)(puVar2 + 2) != pNVar4 + uVar7);
    }
    clear(this);
    this->data_ = pNVar5;
    this->size_ = uVar7;
    this->capacity_ = sVar8;
  }
  pNVar5[uVar7].array.data_ = (int *)0x0;
  pNVar5[uVar7].array.size_ = 0;
  OPENSSL_free((void *)0x0);
  pNVar5[uVar7].array.data_ = (int *)0x0;
  pNVar5[uVar7].array.size_ = 0;
  pNVar5[uVar7].array.data_ = (elem->array).data_;
  pNVar5[uVar7].array.size_ = (elem->array).size_;
  (elem->array).data_ = (int *)0x0;
  (elem->array).size_ = 0;
  this->size_ = this->size_ + 1;
  return true;
}

Assistant:

[[nodiscard]] bool Push(T elem) {
    if (!MaybeGrow()) {
      return false;
    }
    new (&data_[size_]) T(std::move(elem));
    size_++;
    return true;
  }